

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

Node * __thiscall llvm::yaml::Document::parseBlockNode(Document *this)

{
  StringRef Val;
  StringRef RawVal;
  StringRef Tag;
  StringRef Tag_00;
  StringRef Tag_01;
  StringRef Tag_02;
  StringRef Tag_03;
  StringRef Tag_04;
  StringRef Tag_05;
  StringRef Tag_06;
  bool bVar1;
  Token *pTVar2;
  SequenceNode *this_00;
  StringRef Anchor;
  StringRef Anchor_00;
  StringRef Anchor_01;
  StringRef Anchor_02;
  StringRef Anchor_03;
  StringRef Anchor_04;
  StringRef Anchor_05;
  StringRef Anchor_06;
  StringRef SVar3;
  undefined1 local_2b8 [56];
  undefined1 local_280 [56];
  undefined1 local_248 [56];
  undefined1 local_210 [56];
  undefined1 local_1d8 [56];
  undefined1 local_1a0 [56];
  undefined1 local_168 [56];
  StringRef local_130;
  Child local_120;
  StringRef NullTerminatedStr;
  string local_108 [32];
  StringRef local_e8;
  undefined1 local_d8 [8];
  Token T;
  Token AnchorInfo;
  Token TagInfo;
  
  pTVar2 = peekNext(this);
  Token::Token((Token *)local_d8,pTVar2);
  T.Value.field_2._8_4_ = 0;
  AnchorInfo.Kind = TK_Error;
  AnchorInfo._4_4_ = 0;
  AnchorInfo.Range.Data = (char *)0x0;
  AnchorInfo.Range.Length = (size_t)&AnchorInfo.Value._M_string_length;
  AnchorInfo.Value._M_dataplus._M_p = (pointer)0x0;
  AnchorInfo.Value.field_2._8_4_ = 0;
  TagInfo.Kind = TK_Error;
  TagInfo._4_4_ = 0;
  TagInfo.Range.Data = (char *)0x0;
  TagInfo.Range.Length = (size_t)&TagInfo.Value._M_string_length;
  TagInfo.Value._M_dataplus._M_p = (pointer)0x0;
  AnchorInfo.Value._M_string_length._0_1_ = 0;
  TagInfo.Value._M_string_length._0_1_ = 0;
  do {
    switch(local_d8._0_4_) {
    default:
      this_00 = (SequenceNode *)Node::operator_new(0x48,&this->NodeAllocator,0x10);
      if (this_00 != (SequenceNode *)0x0) {
        NullNode::NullNode((NullNode *)this_00,&this->stream->CurrentDoc);
        goto LAB_00dca50e;
      }
    case 0:
switchD_00dc9f8f_caseD_0:
      this_00 = (SequenceNode *)0x0;
LAB_00dca50e:
      std::__cxx11::string::~string((string *)&TagInfo.Range.Length);
      std::__cxx11::string::~string((string *)&AnchorInfo.Range.Length);
      std::__cxx11::string::~string((string *)&T.Range.Length);
      return &this_00->super_Node;
    case 7:
      this_00 = (SequenceNode *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
      if (this_00 != (SequenceNode *)0x0) {
        Anchor_04.Length =
             (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
        Anchor_04.Data = (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
        Tag_04.Length = (size_t)TagInfo.Range.Data;
        Tag_04.Data = (char *)TagInfo._0_8_;
        SequenceNode::SequenceNode(this_00,&this->stream->CurrentDoc,Anchor_04,Tag_04,ST_Indentless)
        ;
        goto LAB_00dca50e;
      }
      goto switchD_00dc9f8f_caseD_0;
    case 9:
      getNext((Token *)local_280,this);
      std::__cxx11::string::~string((string *)(local_280 + 0x18));
      this_00 = (SequenceNode *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
      if (this_00 != (SequenceNode *)0x0) {
        Anchor_06.Length =
             (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
        Anchor_06.Data = (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
        Tag_06.Length = (size_t)TagInfo.Range.Data;
        Tag_06.Data = (char *)TagInfo._0_8_;
        SequenceNode::SequenceNode(this_00,&this->stream->CurrentDoc,Anchor_06,Tag_06,ST_Block);
        goto LAB_00dca50e;
      }
      goto switchD_00dc9f8f_caseD_0;
    case 10:
      getNext((Token *)local_248,this);
      std::__cxx11::string::~string((string *)(local_248 + 0x18));
      this_00 = (SequenceNode *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
      if (this_00 != (SequenceNode *)0x0) {
        Anchor_03.Length =
             (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
        Anchor_03.Data = (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
        Tag_03.Length = (size_t)TagInfo.Range.Data;
        Tag_03.Data = (char *)TagInfo._0_8_;
        MappingNode::MappingNode
                  ((MappingNode *)this_00,&this->stream->CurrentDoc,Anchor_03,Tag_03,MT_Block);
        goto LAB_00dca50e;
      }
      goto switchD_00dc9f8f_caseD_0;
    case 0xb:
    case 0xd:
    case 0xf:
      if (this->Root != (Node *)0x0) {
        bVar1 = isa_impl_wrap<llvm::yaml::MappingNode,_llvm::yaml::Node_*const,_const_llvm::yaml::Node_*>
                ::doit(&this->Root);
        if ((bVar1) ||
           (bVar1 = isa_impl_wrap<llvm::yaml::SequenceNode,_llvm::yaml::Node_*const,_const_llvm::yaml::Node_*>
                    ::doit(&this->Root), bVar1)) {
          this_00 = (SequenceNode *)Node::operator_new(0x48,&this->NodeAllocator,0x10);
          if (this_00 != (SequenceNode *)0x0) {
            NullNode::NullNode((NullNode *)this_00,&this->stream->CurrentDoc);
            goto LAB_00dca50e;
          }
          goto switchD_00dc9f8f_caseD_0;
        }
      }
      Twine::Twine((Twine *)&local_120,"Unexpected token");
      setError(this,(Twine *)&local_120,(Token *)local_d8);
      goto switchD_00dc9f8f_caseD_0;
    case 0xc:
      getNext((Token *)local_210,this);
      std::__cxx11::string::~string((string *)(local_210 + 0x18));
      this_00 = (SequenceNode *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
      if (this_00 != (SequenceNode *)0x0) {
        Anchor_00.Length =
             (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
        Anchor_00.Data = (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
        Tag_00.Length = (size_t)TagInfo.Range.Data;
        Tag_00.Data = (char *)TagInfo._0_8_;
        SequenceNode::SequenceNode(this_00,&this->stream->CurrentDoc,Anchor_00,Tag_00,ST_Flow);
        goto LAB_00dca50e;
      }
      goto switchD_00dc9f8f_caseD_0;
    case 0xe:
      getNext((Token *)local_1d8,this);
      std::__cxx11::string::~string((string *)(local_1d8 + 0x18));
      this_00 = (SequenceNode *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
      if (this_00 != (SequenceNode *)0x0) {
        Anchor_05.Length =
             (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
        Anchor_05.Data = (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
        Tag_05.Length = (size_t)TagInfo.Range.Data;
        Tag_05.Data = (char *)TagInfo._0_8_;
        MappingNode::MappingNode
                  ((MappingNode *)this_00,&this->stream->CurrentDoc,Anchor_05,Tag_05,MT_Flow);
        goto LAB_00dca50e;
      }
      goto switchD_00dc9f8f_caseD_0;
    case 0x10:
      this_00 = (SequenceNode *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
      if (this_00 != (SequenceNode *)0x0) {
        Anchor.Length = (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
        Anchor.Data = (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
        Tag.Length = (size_t)TagInfo.Range.Data;
        Tag.Data = (char *)TagInfo._0_8_;
        MappingNode::MappingNode
                  ((MappingNode *)this_00,&this->stream->CurrentDoc,Anchor,Tag,MT_Inline);
        goto LAB_00dca50e;
      }
      goto switchD_00dc9f8f_caseD_0;
    case 0x12:
      getNext((Token *)local_1a0,this);
      std::__cxx11::string::~string((string *)(local_1a0 + 0x18));
      this_00 = (SequenceNode *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
      if (this_00 != (SequenceNode *)0x0) {
        Anchor_01.Length =
             (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
        Anchor_01.Data = (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
        Tag_01.Length = (size_t)TagInfo.Range.Data;
        Tag_01.Data = (char *)TagInfo._0_8_;
        Val.Length = (size_t)T.Range.Data;
        Val.Data = (char *)T._0_8_;
        ScalarNode::ScalarNode((ScalarNode *)this_00,&this->stream->CurrentDoc,Anchor_01,Tag_01,Val)
        ;
        goto LAB_00dca50e;
      }
      goto switchD_00dc9f8f_caseD_0;
    case 0x13:
      getNext((Token *)local_168,this);
      std::__cxx11::string::~string((string *)(local_168 + 0x18));
      NullTerminatedStr.Data = T.Value._M_dataplus._M_p + 1;
      local_120 = (Child)T.Range.Length;
      local_130 = StringRef::copy<llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>
                            ((StringRef *)&local_120,&this->NodeAllocator);
      SVar3 = StringRef::drop_back(&local_130,1);
      this_00 = (SequenceNode *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
      if (this_00 != (SequenceNode *)0x0) {
        Anchor_02.Length =
             (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
        Anchor_02.Data = (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
        Tag_02.Length = (size_t)TagInfo.Range.Data;
        Tag_02.Data = (char *)TagInfo._0_8_;
        RawVal.Length = (size_t)T.Range.Data;
        RawVal.Data = (char *)T._0_8_;
        local_e8 = SVar3;
        BlockScalarNode::BlockScalarNode
                  ((BlockScalarNode *)this_00,&this->stream->CurrentDoc,Anchor_02,Tag_02,SVar3,
                   RawVal);
      }
      goto LAB_00dca50e;
    case 0x14:
      getNext((Token *)local_2b8,this);
      std::__cxx11::string::~string((string *)(local_2b8 + 0x18));
      this_00 = (SequenceNode *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
      if (this_00 != (SequenceNode *)0x0) {
        SVar3.Length = (long)T.Range.Data - (ulong)(T.Range.Data != (char *)0x0);
        SVar3.Data = (char *)((ulong)(T.Range.Data != (char *)0x0) + T._0_8_);
        AliasNode::AliasNode((AliasNode *)this_00,&this->stream->CurrentDoc,SVar3);
        goto LAB_00dca50e;
      }
      goto switchD_00dc9f8f_caseD_0;
    case 0x15:
      if (T.Value.field_2._8_4_ == 0x15) {
        Twine::Twine((Twine *)&local_120,"Already encountered an anchor for this node!");
        setError(this,(Twine *)&local_120,(Token *)local_d8);
        goto switchD_00dc9f8f_caseD_0;
      }
      getNext((Token *)&local_120,this);
      pTVar2 = &T;
      break;
    case 0x16:
      if (AnchorInfo.Value.field_2._8_4_ == 0x16) {
        Twine::Twine((Twine *)&local_120,"Already encountered a tag for this node!");
        setError(this,(Twine *)&local_120,(Token *)local_d8);
        goto switchD_00dc9f8f_caseD_0;
      }
      getNext((Token *)&local_120,this);
      pTVar2 = &AnchorInfo;
    }
    Token::operator=((Token *)((long)&(pTVar2->Value).field_2 + 8),(Token *)&local_120);
    std::__cxx11::string::~string(local_108);
    pTVar2 = peekNext(this);
    Token::operator=((Token *)local_d8,pTVar2);
  } while( true );
}

Assistant:

Node *Document::parseBlockNode() {
  Token T = peekNext();
  // Handle properties.
  Token AnchorInfo;
  Token TagInfo;
parse_property:
  switch (T.Kind) {
  case Token::TK_Alias:
    getNext();
    return new (NodeAllocator) AliasNode(stream.CurrentDoc, T.Range.substr(1));
  case Token::TK_Anchor:
    if (AnchorInfo.Kind == Token::TK_Anchor) {
      setError("Already encountered an anchor for this node!", T);
      return nullptr;
    }
    AnchorInfo = getNext(); // Consume TK_Anchor.
    T = peekNext();
    goto parse_property;
  case Token::TK_Tag:
    if (TagInfo.Kind == Token::TK_Tag) {
      setError("Already encountered a tag for this node!", T);
      return nullptr;
    }
    TagInfo = getNext(); // Consume TK_Tag.
    T = peekNext();
    goto parse_property;
  default:
    break;
  }

  switch (T.Kind) {
  case Token::TK_BlockEntry:
    // We got an unindented BlockEntry sequence. This is not terminated with
    // a BlockEnd.
    // Don't eat the TK_BlockEntry, SequenceNode needs it.
    return new (NodeAllocator) SequenceNode( stream.CurrentDoc
                                           , AnchorInfo.Range.substr(1)
                                           , TagInfo.Range
                                           , SequenceNode::ST_Indentless);
  case Token::TK_BlockSequenceStart:
    getNext();
    return new (NodeAllocator)
      SequenceNode( stream.CurrentDoc
                  , AnchorInfo.Range.substr(1)
                  , TagInfo.Range
                  , SequenceNode::ST_Block);
  case Token::TK_BlockMappingStart:
    getNext();
    return new (NodeAllocator)
      MappingNode( stream.CurrentDoc
                 , AnchorInfo.Range.substr(1)
                 , TagInfo.Range
                 , MappingNode::MT_Block);
  case Token::TK_FlowSequenceStart:
    getNext();
    return new (NodeAllocator)
      SequenceNode( stream.CurrentDoc
                  , AnchorInfo.Range.substr(1)
                  , TagInfo.Range
                  , SequenceNode::ST_Flow);
  case Token::TK_FlowMappingStart:
    getNext();
    return new (NodeAllocator)
      MappingNode( stream.CurrentDoc
                 , AnchorInfo.Range.substr(1)
                 , TagInfo.Range
                 , MappingNode::MT_Flow);
  case Token::TK_Scalar:
    getNext();
    return new (NodeAllocator)
      ScalarNode( stream.CurrentDoc
                , AnchorInfo.Range.substr(1)
                , TagInfo.Range
                , T.Range);
  case Token::TK_BlockScalar: {
    getNext();
    StringRef NullTerminatedStr(T.Value.c_str(), T.Value.length() + 1);
    StringRef StrCopy = NullTerminatedStr.copy(NodeAllocator).drop_back();
    return new (NodeAllocator)
        BlockScalarNode(stream.CurrentDoc, AnchorInfo.Range.substr(1),
                        TagInfo.Range, StrCopy, T.Range);
  }
  case Token::TK_Key:
    // Don't eat the TK_Key, KeyValueNode expects it.
    return new (NodeAllocator)
      MappingNode( stream.CurrentDoc
                 , AnchorInfo.Range.substr(1)
                 , TagInfo.Range
                 , MappingNode::MT_Inline);
  case Token::TK_DocumentStart:
  case Token::TK_DocumentEnd:
  case Token::TK_StreamEnd:
  default:
    // TODO: Properly handle tags. "[!!str ]" should resolve to !!str "", not
    //       !!null null.
    return new (NodeAllocator) NullNode(stream.CurrentDoc);
  case Token::TK_FlowMappingEnd:
  case Token::TK_FlowSequenceEnd:
  case Token::TK_FlowEntry: {
    if (Root && (isa<MappingNode>(Root) || isa<SequenceNode>(Root)))
      return new (NodeAllocator) NullNode(stream.CurrentDoc);

    setError("Unexpected token", T);
    return nullptr;
  }
  case Token::TK_Error:
    return nullptr;
  }
  llvm_unreachable("Control flow shouldn't reach here.");
  return nullptr;
}